

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

void __thiscall
boost::detail::shared_count::
shared_count<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>>,DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>>
          (shared_count *this,
          grammar_helper<boost::spirit::classic::grammar<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>
          *p)

{
  _func_int **pp_Var1;
  sp_counted_impl_p<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>_>
  *in_RDI;
  grammar_helper<boost::spirit::classic::grammar<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>
  *in_stack_ffffffffffffffc8;
  
  (in_RDI->super_sp_counted_base)._vptr_sp_counted_base = (_func_int **)0x0;
  pp_Var1 = (_func_int **)operator_new(0x18);
  sp_counted_impl_p<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DecPOMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>_>
  ::sp_counted_impl_p(in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super_sp_counted_base)._vptr_sp_counted_base = pp_Var1;
  return;
}

Assistant:

explicit shared_count( Y * p ): pi_( 0 )
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        , id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_p<Y>( p );
        }
        catch(...)
        {
            boost::checked_delete( p );
            throw;
        }

#else

        pi_ = new sp_counted_impl_p<Y>( p );

        if( pi_ == 0 )
        {
            boost::checked_delete( p );
            boost::throw_exception( std::bad_alloc() );
        }

#endif
    }